

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.h
# Opt level: O2

void __thiscall ConvexDecomposition::ConvexResult::ConvexResult(ConvexResult *this,ConvexResult *r)

{
  float *__dest;
  uint *__dest_00;
  ulong uVar1;
  
  uVar1 = (ulong)r->mHullVcount;
  this->mHullVcount = r->mHullVcount;
  if (uVar1 == 0) {
    this->mHullVertices = (float *)0x0;
  }
  else {
    __dest = (float *)operator_new__(uVar1 * 0x30);
    this->mHullVertices = __dest;
    memcpy(__dest,r->mHullVertices,uVar1 * 0xc);
  }
  uVar1 = (ulong)r->mHullTcount;
  this->mHullTcount = r->mHullTcount;
  if (uVar1 != 0) {
    __dest_00 = (uint *)operator_new__(uVar1 * 0x30);
    this->mHullIndices = __dest_00;
    memcpy(__dest_00,r->mHullIndices,uVar1 * 0xc);
    return;
  }
  this->mHullIndices = (uint *)0x0;
  return;
}

Assistant:

ConvexResult(const ConvexResult &r)
		{
			mHullVcount = r.mHullVcount;
			if ( mHullVcount )
			{
				mHullVertices = new float[mHullVcount*sizeof(float)*3];
				memcpy(mHullVertices, r.mHullVertices, sizeof(float)*3*mHullVcount );
			}
			else
			{
				mHullVertices = 0;
			}
			mHullTcount = r.mHullTcount;
			if ( mHullTcount )
			{
				mHullIndices = new unsigned int[sizeof(unsigned int)*mHullTcount*3];
				memcpy(mHullIndices, r.mHullIndices, sizeof(unsigned int)*mHullTcount*3 );
			}
			else
			{
				mHullIndices = 0;
			}
		}